

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void seterrorobj(lua_State *L,int errcode,StkId oldtop)

{
  StkId pTVar1;
  undefined4 uVar2;
  TString *pTVar3;
  TValue *io1;
  TString *x__1;
  TValue *io_1;
  TString *x_;
  TValue *io;
  StkId oldtop_local;
  int errcode_local;
  lua_State *L_local;
  
  if (errcode == 4) {
    pTVar3 = L->l_G->memerrmsg;
    (oldtop->value_).gc = (GCObject *)pTVar3;
    oldtop->tt_ = pTVar3->tt | 0x40;
  }
  else if (errcode == 6) {
    pTVar3 = luaS_newlstr(L,"error in error handling",0x17);
    (oldtop->value_).gc = (GCObject *)pTVar3;
    oldtop->tt_ = pTVar3->tt | 0x40;
  }
  else {
    pTVar1 = L->top;
    oldtop->value_ = pTVar1[-1].value_;
    uVar2 = *(undefined4 *)&pTVar1[-1].field_0xc;
    oldtop->tt_ = pTVar1[-1].tt_;
    *(undefined4 *)&oldtop->field_0xc = uVar2;
  }
  L->top = oldtop + 1;
  return;
}

Assistant:

static void seterrorobj(lua_State *L, int errcode, StkId oldtop) {
    switch (errcode) {
        case LUA_ERRMEM: {  /* memory error? */
            setsvalue2s(L, oldtop, G(L)->memerrmsg); /* reuse preregistered msg. */
            break;
        }
        case LUA_ERRERR: {
            setsvalue2s(L, oldtop, luaS_newliteral(L, "error in error handling"));
            break;
        }
        default: {
            setobjs2s(L, oldtop, L->top - 1);  /* error message on current top */
            break;
        }
    }
    L->top = oldtop + 1;
}